

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O1

int pattcmp(uchar *a,uchar *b,size_t l)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  size_t __n;
  size_t sVar5;
  char *p;
  uchar *local_40;
  ulong local_38;
  
  iVar1 = bcmp(a,b,l);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar4 = 0;
    sVar5 = 0;
    if (l == 0) {
      uVar3 = 0;
    }
    else {
      do {
        if ((byte)(a[sVar5] - 0x30) < 10) {
          uVar3 = strtoul((char *)(a + sVar5),(char **)&local_40,10);
          if (a + sVar5 == local_40) {
            return 1;
          }
          goto LAB_006e3746;
        }
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
      uVar3 = 0;
      sVar5 = l;
    }
LAB_006e3746:
    if (l == 0) {
      __n = 0;
    }
    else {
      __n = 0;
      do {
        if ((byte)(b[__n] - 0x30) < 10) {
          local_38 = uVar3;
          uVar3 = strtoul((char *)(b + __n),(char **)&local_40,10);
          if (b + __n == local_40) {
            return -1;
          }
          iVar4 = (int)uVar3;
          uVar3 = local_38;
          goto LAB_006e3799;
        }
        __n = __n + 1;
      } while (l != __n);
      iVar4 = 0;
      __n = l;
    }
LAB_006e3799:
    iVar1 = -1;
    if (__n <= sVar5) {
      iVar2 = memcmp(a,b,__n);
      iVar1 = (int)uVar3 - iVar4;
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int pattcmp( const unsigned char * a, const unsigned char * b, size_t l )
{
	size_t i, j;
	int na = 0, nb = 0, k;
	char * p;

	k = memcmp( a, b, l );
	if ( !k ) return k;

	/* damnit */

	for ( i = 0; i < l; ++i )
	{
		if ( a [i] >= '0' && a [i] <= '9' ) break;
	}

	if ( i < l )
	{
		na = strtoul( (const char *)a + i, &p, 10 );
		if ( p == (const char *)a + i ) return 1;
	}

	for ( j = 0; j < l; ++j )
	{
		if ( b [j] >= '0' && b [j] <= '9' ) break;
	}

	if ( j < l )
	{
		nb = strtoul( (const char *)b + j, &p, 10 );
		if ( p == (const char *)b + j ) return -1;
	}

	if ( i < j ) return -1;
	else if ( j > i ) return 1;

	k = memcmp( a, b, j );
	if ( k ) return k;

	return na - nb;
}